

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_rb_seek_write(ma_rb *pRB,size_t offsetInBytes)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pRB != (ma_rb *)0x0) {
    uVar2 = pRB->encodedWriteOffset & 0x7fffffff;
    uVar1 = pRB->encodedWriteOffset & 0x80000000;
    if ((pRB->encodedReadOffset & 0x80000000) == uVar1) {
      uVar3 = uVar2 + offsetInBytes;
      if (pRB->subbufferSizeInBytes <= uVar3) {
        uVar1 = uVar1 + 0x80000000;
        uVar3 = (ulong)((int)uVar3 - pRB->subbufferSizeInBytes);
      }
    }
    else {
      uVar5 = (ulong)(pRB->encodedReadOffset & 0x7fffffff);
      uVar4 = uVar2 + offsetInBytes;
      uVar3 = uVar4 & 0xffffffff;
      if (uVar5 < uVar4) {
        uVar3 = uVar5;
      }
    }
    LOCK();
    pRB->encodedWriteOffset = uVar1 | (uint)uVar3;
    UNLOCK();
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_rb_seek_write(ma_rb* pRB, size_t offsetInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newWriteOffsetInBytes;
    ma_uint32 newWriteOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    newWriteOffsetLoopFlag = writeOffsetLoopFlag;

    /* We cannot go past the write buffer. */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        /* May end up looping. */
        if ((writeOffsetInBytes + offsetInBytes) >= pRB->subbufferSizeInBytes) {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes) - pRB->subbufferSizeInBytes;
            newWriteOffsetLoopFlag ^= 0x80000000;    /* <-- Looped. */
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    } else {
        if ((writeOffsetInBytes + offsetInBytes) > readOffsetInBytes) {
            newWriteOffsetInBytes = readOffsetInBytes;
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    }

    ma_atomic_exchange_32(&pRB->encodedWriteOffset, ma_rb__construct_offset(newWriteOffsetInBytes, newWriteOffsetLoopFlag));
    return MA_SUCCESS;
}